

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeWriter.cpp
# Opt level: O2

void __thiscall CodeWriter::loadWord(CodeWriter *this,string *Ri,int K,string *Rj)

{
  string sStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::append((string *)this);
  std::__cxx11::to_string(&sStack_68,K);
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::operator+(&local_48,"(",Rj);
  std::operator+(&sStack_68,&local_48,")");
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::append((string *)this);
  return;
}

Assistant:

void CodeWriter::loadWord(const std::string &Ri, int K, const std::string &Rj) {
    moonOutput += tab;
    moonOutput += loadOp;
    moonOutput += tab;
    moonOutput += Ri;
    moonOutput += comma;
    moonOutput += std::to_string(K);
    moonOutput += "(" + Rj + ")";
    moonOutput += newLine;
}